

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::ComputeLessThanRange::operator()
          (ComputeLessThanRange *this,Random *rnd,bool dstMin,bool dstMax,int *aMin,int *aMax,
          int *bMin,int *bMax)

{
  int iVar1;
  int iVar2;
  GetRandom local_51 [8];
  GetRandom local_49;
  int aLen_1;
  int local_44;
  int aLen;
  int rMax;
  GetRandom local_35;
  int rMin;
  int *piStack_30;
  int rLen;
  int *aMax_local;
  int *aMin_local;
  bool dstMax_local;
  Random *pRStack_18;
  bool dstMin_local;
  Random *rnd_local;
  ComputeLessThanRange *this_local;
  
  piStack_30 = aMax;
  aMax_local = aMin;
  aMin_local._6_1_ = dstMax;
  aMin_local._7_1_ = dstMin;
  pRStack_18 = rnd;
  rnd_local = (Random *)this;
  rMin = operator()<int>::GetRandom::operator()(&local_35,rnd,0,8);
  rMax = operator()<int>::GetRandom::operator()((GetRandom *)((long)&aLen + 3),pRStack_18,-4,4);
  local_44 = rMax + rMin;
  if (((aMin_local._7_1_ & 1) == 0) && ((aMin_local._6_1_ & 1) == 1)) {
    *aMax_local = rMax;
    *piStack_30 = local_44;
    *bMin = rMax;
    *bMax = local_44;
  }
  else if (((aMin_local._7_1_ & 1) == 1) && ((aMin_local._6_1_ & 1) == 1)) {
    aLen_1 = operator()<int>::GetRandom::operator()(&local_49,pRStack_18,0,8 - rMin);
    iVar2 = rMax;
    iVar1 = anon_unknown_71::getStep<int>();
    *piStack_30 = iVar2 - iVar1;
    *aMax_local = *piStack_30 - aLen_1;
    *bMin = rMax;
    *bMax = local_44;
  }
  else {
    iVar2 = operator()<int>::GetRandom::operator()(local_51,pRStack_18,0,8 - rMin);
    *aMax_local = local_44;
    *piStack_30 = *aMax_local + iVar2;
    *bMin = rMax;
    *bMax = local_44;
  }
  return;
}

Assistant:

void ComputeLessThanRange::operator () (de::Random& rnd, bool dstMin, bool dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& random, int min, int max) const		{ return random.getInt(min, max); }
		float	operator() (de::Random& random, float min, float max) const	{ return getQuantizedFloat(random, min, max, getStep<float>()); }
	};

	// One random range
	T	rLen	= GetRandom()(rnd, T(0), T(8));
	T	rMin	= GetRandom()(rnd, T(-4), T(4));
	T	rMax	= rMin+rLen;

	if (dstMin == false && dstMax == true)
	{
		// Both values are possible, use same range for both inputs
		aMin	= rMin;
		aMax	= rMax;
		bMin	= rMin;
		bMax	= rMax;
	}
	else if (dstMin == true && dstMax == true)
	{
		// Compute range that is less than rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMax	= rMin - getStep<T>();
		aMin	= aMax - aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
	else
	{
		// Compute range that is greater than or equal to rMin..rMax
		T aLen = GetRandom()(rnd, T(0), T(8)-rLen);

		aMin	= rMax;
		aMax	= aMin + aLen;

		bMin	= rMin;
		bMax	= rMax;
	}
}